

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

int secp256k1_musig_partial_sig_serialize
              (secp256k1_context *ctx,uchar *out32,secp256k1_musig_partial_sig *sig)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  
  if (out32 == (uchar *)0x0) {
    secp256k1_musig_partial_sig_serialize_cold_3();
  }
  else if (sig == (secp256k1_musig_partial_sig *)0x0) {
    secp256k1_musig_partial_sig_serialize_cold_2();
  }
  else {
    lVar4 = 0;
    do {
      iVar5 = (uint)sig->data[lVar4] - (uint)secp256k1_musig_partial_sig_magic[lVar4];
      if (sig->data[lVar4] != secp256k1_musig_partial_sig_magic[lVar4]) goto LAB_00111192;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    iVar5 = 0;
LAB_00111192:
    if (iVar5 == 0) {
      uVar1 = *(undefined8 *)(sig->data + 4);
      uVar2 = *(undefined8 *)(sig->data + 0xc);
      uVar3 = *(undefined8 *)(sig->data + 0x1c);
      *(undefined8 *)(out32 + 0x10) = *(undefined8 *)(sig->data + 0x14);
      *(undefined8 *)(out32 + 0x18) = uVar3;
      *(undefined8 *)out32 = uVar1;
      *(undefined8 *)(out32 + 8) = uVar2;
      return 1;
    }
    secp256k1_musig_partial_sig_serialize_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_musig_partial_sig_serialize(const secp256k1_context* ctx, unsigned char *out32, const secp256k1_musig_partial_sig* sig) {
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(out32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(secp256k1_memcmp_var(&sig->data[0], secp256k1_musig_partial_sig_magic, 4) == 0);

    memcpy(out32, &sig->data[4], 32);
    return 1;
}